

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O2

int cvLsFreeB(CVodeBMem cvB_mem)

{
  if (cvB_mem != (CVodeBMem)0x0) {
    free(cvB_mem->cv_lmem);
  }
  return 0;
}

Assistant:

int cvLsFreeB(CVodeBMem cvB_mem)
{
  CVLsMemB cvlsB_mem;

  /* Return immediately if cvB_mem or cvB_mem->cv_lmem are NULL */
  if (cvB_mem == NULL) { return (CVLS_SUCCESS); }
  if (cvB_mem->cv_lmem == NULL) { return (CVLS_SUCCESS); }
  cvlsB_mem = (CVLsMemB)(cvB_mem->cv_lmem);

  /* free CVLsMemB interface structure */
  free(cvlsB_mem);

  return (CVLS_SUCCESS);
}